

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addRigidBody(Molecule *this,RigidBody *rb)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *in_RDI;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::begin(in_RDI);
  __val = std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::end(in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::RigidBody**,std::vector<OpenMD::RigidBody*,std::allocator<OpenMD::RigidBody*>>>,OpenMD::RigidBody*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>::push_back
              ((vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_> *)
               __last._M_current,__val._M_current);
  }
  return;
}

Assistant:

void Molecule::addRigidBody(RigidBody* rb) {
    if (std::find(rigidBodies_.begin(), rigidBodies_.end(), rb) ==
        rigidBodies_.end()) {
      rigidBodies_.push_back(rb);
    }
  }